

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetMaxStep(void *arkode_mem,realtype hmax)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
LAB_003dfd45:
    arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkSetMaxStep",msgfmt);
  }
  else {
    if (hmax <= 0.0) {
      *(undefined8 *)((long)arkode_mem + 0x178) = 0;
    }
    else {
      if (1.0 < *(double *)((long)arkode_mem + 0x170) * (1.0 / hmax)) {
        msgfmt = "Inconsistent step size limits: hmin > hmax.";
        iVar1 = -0x16;
        error_code = -0x16;
        goto LAB_003dfd45;
      }
      *(double *)((long)arkode_mem + 0x178) = 1.0 / hmax;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMaxStep(void *arkode_mem, realtype hmax)
{
  realtype hmax_inv;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxStep", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing a value <= 0 sets hmax = infinity */
  if (hmax <= ZERO) {
    ark_mem->hmax_inv = ZERO;
    return(ARK_SUCCESS);
  }

  /* check that hmax and hmin are agreeable */
  hmax_inv = ONE/hmax;
  if (hmax_inv * ark_mem->hmin > ONE) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetMaxStep", MSG_ARK_BAD_HMIN_HMAX);
    return(ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmax_inv = hmax_inv;

  return(ARK_SUCCESS);
}